

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O0

bool __thiscall QAbstractSocketPrivate::canReadNotification(QAbstractSocketPrivate *this)

{
  bool bVar1;
  byte bVar2;
  QAbstractSocket *pQVar3;
  qint64 qVar4;
  qint64 qVar5;
  ulong uVar6;
  QAbstractSocketPrivate *in_RDI;
  bool isUdpSocket;
  qint64 oldBufferSize;
  QAbstractSocket *q;
  QAbstractSocketPrivate *in_stack_00000030;
  int channel;
  undefined7 in_stack_ffffffffffffffd8;
  byte in_stack_ffffffffffffffdf;
  
  pQVar3 = q_func(in_RDI);
  if ((in_RDI->isBuffered & 1U) == 0) {
    in_stack_ffffffffffffffdf = in_RDI->socketType == UdpSocket;
    if (((in_RDI->hasPendingData & 1U) != 0) &&
       ((!(bool)in_stack_ffffffffffffffdf || ((in_RDI->hasPendingDatagram & 1U) != 0)))) {
      (**(code **)(*(long *)in_RDI->socketEngine + 0x140))(in_RDI->socketEngine,0);
      return true;
    }
    if ((!(bool)in_stack_ffffffffffffffdf) ||
       (uVar6 = (**(code **)(*(long *)in_RDI->socketEngine + 0xe8))(), (uVar6 & 1) != 0)) {
      in_RDI->hasPendingData = true;
      in_RDI->hasPendingDatagram = (bool)(in_stack_ffffffffffffffdf & 1);
    }
    channel = (int)((ulong)in_RDI >> 0x20);
  }
  else {
    qVar4 = QIODevicePrivate::QRingBufferRef::size((QRingBufferRef *)in_RDI);
    if ((in_RDI->readBufferMaxSize != 0) && (in_RDI->readBufferMaxSize <= qVar4)) {
      (**(code **)(*(long *)in_RDI->socketEngine + 0x140))(in_RDI->socketEngine,0);
      return false;
    }
    bVar1 = readFromSocket(in_stack_00000030);
    if (!bVar1) {
      (**(code **)(*(long *)pQVar3 + 0x100))();
      return false;
    }
    qVar5 = QIODevicePrivate::QRingBufferRef::size((QRingBufferRef *)in_RDI);
    channel = (int)((ulong)in_RDI >> 0x20);
    if (qVar5 == qVar4) {
      bVar2 = QIODevice::isReadable();
      return (bool)((bVar2 ^ 0xff) & 1);
    }
  }
  emitReadyRead((QAbstractSocketPrivate *)
                CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),channel);
  return true;
}

Assistant:

bool QAbstractSocketPrivate::canReadNotification()
{
    Q_Q(QAbstractSocket);
#if defined (QABSTRACTSOCKET_DEBUG)
    qDebug("QAbstractSocketPrivate::canReadNotification()");
#endif

    // If buffered, read data from the socket into the read buffer
    if (isBuffered) {
        const qint64 oldBufferSize = buffer.size();

        // Return if there is no space in the buffer
        if (readBufferMaxSize && oldBufferSize >= readBufferMaxSize) {
            socketEngine->setReadNotificationEnabled(false);
#if defined (QABSTRACTSOCKET_DEBUG)
            qDebug("QAbstractSocketPrivate::canReadNotification() buffer is full");
#endif
            return false;
        }

        // If reading from the socket fails after getting a read
        // notification, close the socket.
        if (!readFromSocket()) {
#if defined (QABSTRACTSOCKET_DEBUG)
            qDebug("QAbstractSocketPrivate::canReadNotification() disconnecting socket");
#endif
            q->disconnectFromHost();
            return false;
        }

        // Return if there is no new data available.
        if (buffer.size() == oldBufferSize) {
            // If the socket is opened only for writing, return true
            // to indicate that the data was discarded.
            return !q->isReadable();
        }
    } else {
        const bool isUdpSocket = (socketType == QAbstractSocket::UdpSocket);
        if (hasPendingData && (!isUdpSocket || hasPendingDatagram)) {
            socketEngine->setReadNotificationEnabled(false);
            return true;
        }
        if (!isUdpSocket
#if QT_CONFIG(udpsocket)
            || socketEngine->hasPendingDatagrams()
#endif
        ) {
            hasPendingData = true;
            hasPendingDatagram = isUdpSocket;
        }
    }

    emitReadyRead();

#if defined (QABSTRACTSOCKET_DEBUG)
    // If we were closed as a result of the readyRead() signal.
    if (state == QAbstractSocket::UnconnectedState || state == QAbstractSocket::ClosingState)
        qDebug("QAbstractSocketPrivate::canReadNotification() socket is closing - returning");
#endif

    return true;
}